

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O0

int fp_preflight(int argc,char **argv,int unpack,fpstate *fpptr)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  int in_EDI;
  int nfiles;
  int namelen;
  int iarg;
  char outfits [513];
  char infits [513];
  char *in_stack_fffffffffffffba8;
  int local_444;
  undefined4 local_43c;
  char local_438 [525];
  char acStack_22b [523];
  long local_20;
  int local_14;
  long local_10;
  int local_4;
  
  local_444 = 0;
  if (*(int *)(in_RCX + 0x69c) != 0x2a) {
    fp_msg((char *)0x1075ba);
    exit(-1);
  }
  local_43c = *(int *)(in_RCX + 0x698);
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  while( true ) {
    if (local_4 <= local_43c) {
      *(int *)(local_20 + 0x6a0) = *(int *)(local_20 + 0x6a0) + 1;
      return 0;
    }
    local_438[0] = '\0';
    sVar3 = strlen(*(char **)(local_10 + (long)local_43c * 8));
    if (0x1fd < sVar3) {
      fp_msg((char *)0x107616);
      fp_msg((char *)0x10762c);
      fp_msg((char *)0x107638);
      fp_noop();
      exit(-1);
    }
    strncpy(acStack_22b + 3,*(char **)(local_10 + (long)local_43c * 8),0x201);
    if ((acStack_22b[3] == '-') && (acStack_22b[4] != '\0')) {
      fp_msg((char *)0x107690);
      fp_msg((char *)0x1076a6);
      fp_msg((char *)0x1076b2);
      fp_noop();
      exit(-1);
    }
    pcVar4 = strchr(acStack_22b + 3,0x5b);
    if ((pcVar4 != (char *)0x0) || (pcVar4 = strchr(acStack_22b + 3,0x5d), pcVar4 != (char *)0x0))
    break;
    if (local_14 == 0) {
      if ((acStack_22b[3] != '-') && (iVar1 = fp_access(in_stack_fffffffffffffba8), iVar1 != 0)) {
        sVar3 = strlen(acStack_22b + 3);
        if (0x200 < sVar3 + 3) {
          fp_msg((char *)0x107ca9);
          fp_msg((char *)0x107cb6);
          fp_msg((char *)0x107cc2);
          fp_noop();
          exit(-1);
        }
        strcat(acStack_22b + 3,".gz");
        iVar1 = fp_access(in_stack_fffffffffffffba8);
        if (iVar1 != 0) {
          sVar3 = strlen(acStack_22b + 3);
          acStack_22b[(long)((int)sVar3 + -3) + 3] = '\0';
          fp_msg((char *)0x107d25);
          fp_msg((char *)0x107d32);
          fp_msg((char *)0x107d3e);
          fp_noop();
          exit(-1);
        }
      }
      sVar3 = strlen(acStack_22b + 3);
      if ((2 < (int)sVar3) && (iVar1 = strcmp(".fz",acStack_22b + (int)sVar3), iVar1 == 0)) {
        fp_msg((char *)0x107d9a);
        fp_msg((char *)0x107da7);
        fp_msg((char *)0x107db3);
        fp_noop();
        exit(-1);
      }
      if ((*(int *)(local_20 + 0x60) == 0) && (*(int *)(local_20 + 0x84) == 0)) {
        if (*(char *)(local_20 + 0x494) == '\0') {
          if (acStack_22b[3] == '-') {
            strcpy(local_438,"input.fits");
          }
          else {
            strcpy(local_438,acStack_22b + 3);
          }
          sVar3 = strlen(local_438);
          iVar1 = (int)sVar3;
          if ((iVar1 < 3) || (iVar2 = strcmp(".gz",local_438 + (long)iVar1 + -3), iVar2 != 0)) {
            if ((3 < iVar1) && (iVar2 = strcmp(".bz2",local_438 + (long)iVar1 + -4), iVar2 == 0)) {
              local_438[iVar1 + -4] = '\0';
            }
          }
          else {
            local_438[iVar1 + -3] = '\0';
          }
          sVar3 = strlen(local_438);
          iVar1 = (int)sVar3;
          if ((3 < iVar1) && (iVar2 = strcmp(".imh",local_438 + (long)iVar1 + -4), iVar2 == 0)) {
            local_438[iVar1 + -4] = '\0';
            sVar3 = strlen(local_438);
            if (sVar3 == 0x1fc) {
              strcat(local_438,".fit");
            }
            else {
              strcat(local_438,".fits");
            }
          }
          if (*(int *)(local_20 + 0x68) == 0) {
            sVar3 = strlen(local_438);
            if (0x1fd < sVar3) {
              fp_msg((char *)0x107ffc);
              fp_msg((char *)0x108006);
              fp_msg((char *)0x108012);
              fp_noop();
              exit(-1);
            }
            strcat(local_438,".fz");
          }
          iVar1 = strcmp(acStack_22b + 3,local_438);
          if ((iVar1 != 0) && (iVar1 = fp_access(in_stack_fffffffffffffba8), iVar1 == 0)) {
            fp_msg((char *)0x108066);
            fp_msg((char *)0x108070);
            fp_msg((char *)0x10807c);
            fp_noop();
            exit(-1);
          }
        }
        else {
          local_444 = local_444 + 1;
          if (1 < local_444) {
            fp_msg((char *)0x107e19);
            fp_msg((char *)0x107e2d);
            fp_msg((char *)0x107e39);
            fp_noop();
            exit(-1);
          }
          iVar1 = fp_access(in_stack_fffffffffffffba8);
          if (iVar1 == 0) {
            fp_msg((char *)0x107e6d);
            fp_msg((char *)0x107e81);
            fp_msg((char *)0x107e8d);
            fp_noop();
            exit(-1);
          }
        }
      }
    }
    else {
      if (acStack_22b[3] != '-') {
        iVar1 = fp_access(in_stack_fffffffffffffba8);
        if (iVar1 == 0) {
          sVar3 = strlen(acStack_22b + 3);
          strcat(acStack_22b + 3,".fz");
          iVar1 = fp_access(in_stack_fffffffffffffba8);
          if (iVar1 == 0) {
            acStack_22b[(long)(int)sVar3 + 3] = '\0';
            fp_msg((char *)0x10782b);
            fp_msg((char *)0x107838);
            fp_msg((char *)0x107844);
            fp_msg((char *)0x107851);
            fp_msg((char *)0x10785d);
            fp_noop();
            exit(-1);
          }
          acStack_22b[(long)(int)sVar3 + 3] = '\0';
        }
        else {
          strcat(acStack_22b + 3,".fz");
          iVar1 = fp_access(in_stack_fffffffffffffba8);
          if (iVar1 != 0) {
            sVar3 = strlen(acStack_22b + 3);
            acStack_22b[(long)((int)sVar3 + -3) + 3] = '\0';
            fp_msg((char *)0x1077ae);
            fp_msg((char *)0x1077bb);
            fp_msg((char *)0x1077c7);
            fp_noop();
            exit(-1);
          }
        }
      }
      if (*(int *)(local_20 + 0x60) == 0) {
        if (*(char *)(local_20 + 0x494) == '\0') {
          if (*(char *)(local_20 + 0x8c) != '\0') {
            sVar3 = strlen((char *)(local_20 + 0x8c));
            sVar5 = strlen(acStack_22b + 3);
            if (0x200 < sVar3 + sVar5) {
              fp_msg((char *)0x1079a5);
              fp_msg((char *)0x1079b2);
              fp_msg((char *)0x1079be);
              fp_noop();
              exit(-1);
            }
            strcpy(local_438,(char *)(local_20 + 0x8c));
          }
          if (acStack_22b[3] == '-') {
            strcpy(local_438,"output.fits");
          }
          else {
            strcat(local_438,acStack_22b + 3);
          }
          sVar3 = strlen(local_438);
          iVar1 = (int)sVar3;
          if ((iVar1 < 3) || (iVar2 = strcmp(".gz",local_438 + (long)iVar1 + -3), iVar2 != 0)) {
            if ((3 < iVar1) && (iVar2 = strcmp(".bz2",local_438 + (long)iVar1 + -4), iVar2 == 0)) {
              local_438[iVar1 + -4] = '\0';
            }
          }
          else {
            local_438[iVar1 + -3] = '\0';
          }
          if (acStack_22b[3] != '-') {
            sVar3 = strlen(local_438);
            iVar1 = (int)sVar3;
            if ((iVar1 < 3) || (iVar2 = strcmp(".fz",local_438 + (long)iVar1 + -3), iVar2 != 0)) {
              if (*(int *)(local_20 + 0x490) != 0) {
                fp_msg((char *)0x107b0d);
                fp_msg((char *)0x107b1a);
                fp_msg((char *)0x107b26);
                fp_noop();
                exit(-1);
              }
            }
            else {
              local_438[iVar1 + -3] = '\0';
            }
          }
          iVar1 = strcmp(acStack_22b + 3,local_438);
          if ((iVar1 != 0) && (iVar1 = fp_access(in_stack_fffffffffffffba8), iVar1 == 0)) {
            fp_msg((char *)0x107b6b);
            fp_msg((char *)0x107b75);
            fp_msg((char *)0x107b81);
            fp_noop();
            exit(-1);
          }
          if (*(int *)(local_20 + 0x78) != 0) {
            sVar3 = strlen(local_438);
            if (0x200 < sVar3 + 3) {
              fp_msg((char *)0x107bc6);
              fp_msg((char *)0x107bd0);
              fp_msg((char *)0x107bdc);
              fp_noop();
              exit(-1);
            }
            strcat(local_438,".gz");
            iVar1 = fp_access(in_stack_fffffffffffffba8);
            if (iVar1 == 0) {
              fp_msg((char *)0x107c17);
              fp_msg((char *)0x107c21);
              fp_msg((char *)0x107c2d);
              fp_noop();
              exit(-1);
            }
            sVar3 = strlen(local_438);
            local_438[(int)sVar3 + -3] = '\0';
          }
        }
        else {
          local_444 = local_444 + 1;
          if (1 < local_444) {
            fp_msg((char *)0x1078c3);
            fp_msg((char *)0x1078d7);
            fp_msg((char *)0x1078e3);
            fp_noop();
            exit(-1);
          }
          iVar1 = fp_access(in_stack_fffffffffffffba8);
          if (iVar1 == 0) {
            fp_msg((char *)0x107917);
            fp_msg((char *)0x10792b);
            fp_msg((char *)0x107937);
            fp_noop();
            exit(-1);
          }
        }
      }
    }
    local_43c = local_43c + 1;
  }
  fp_msg((char *)0x1076fd);
  fp_msg((char *)0x10770a);
  fp_msg((char *)0x107716);
  fp_noop();
  exit(-1);
}

Assistant:

int fp_preflight (int argc, char *argv[], int unpack, fpstate *fpptr)
{
	char	infits[SZ_STR], outfits[SZ_STR];
	int	iarg, namelen, nfiles = 0;

	if (fpptr->initialized != FP_INIT_MAGIC) {
	    fp_msg ("Error: internal initialization error\n"); exit (-1);
	}

	for (iarg=fpptr->firstfile; iarg < argc; iarg++) {

            outfits[0] = '\0';
	    
            if (strlen(argv[iarg]) > SZ_STR - 4) {  /* allow for .fz or .gz suffix */
		    fp_msg ("Error: input file name\n   "); fp_msg (argv[iarg]);
		    fp_msg ("\n   is too long\n"); fp_noop (); exit (-1);
	    }

	    strncpy (infits, argv[iarg], SZ_STR);
	    if (infits[0] == '-' && infits[1] != '\0') {  
	         /* don't interpret this as intending to read input file from stdin */
		    fp_msg ("Error: invalid input file name\n   "); fp_msg (argv[iarg]);
		    fp_msg ("\n"); fp_noop (); exit (-1);
	    }

	    if (strchr (infits, '[') || strchr (infits, ']')) {
		fp_msg ("Error: section/extension notation not supported: ");
		fp_msg (infits); fp_msg ("\n"); fp_noop (); exit (-1);
	    }
	    
            if (unpack) {
	  	/* ********** This section applies to funpack ************ */

	      /* check that input file  exists */
	      if (infits[0] != '-') {  /* if not reading from stdin stream */
	         if (fp_access (infits) != 0) {  /* if not, then check if */
		    strcat(infits, ".fz");       /* a .fz version exsits */
	            if (fp_access (infits) != 0) {
                        namelen = strlen(infits);
                        infits[namelen - 3] = '\0';  /* remove the .fz suffix */
		        fp_msg ("Error: can't find or read input file "); fp_msg (infits);
		        fp_msg ("\n"); fp_noop (); exit (-1);
                    }
	         } else {   /* make sure a .fz version of the same file doesn't exist */
                    namelen = strlen(infits);
		    strcat(infits, ".fz");   
	            if (fp_access (infits) == 0) {
                        infits[namelen] = '\0';  /* remove the .fz suffix */
		        fp_msg ("Error: ambiguous input file name.  Which file should be unpacked?:\n  ");
		        fp_msg (infits); fp_msg ("\n  "); 
		        fp_msg (infits); fp_msg (".fz\n"); 
		        fp_noop (); exit (-1);
                    } else {
                        infits[namelen] = '\0';  /* remove the .fz suffix */
		    }
	         }
	      }

              /* if writing to stdout, then we are all done */
	      if (fpptr->to_stdout) {
                      continue;
	      }

              if (fpptr->outfile[0]) {  /* user specified output file name */
	          nfiles++;
		  if (nfiles > 1) {
		      fp_msg ("Error: cannot use same output file name for multiple files:\n   ");
		      fp_msg (fpptr->outfile);
		      fp_msg ("\n"); fp_noop (); exit (-1);
	          }

                  /* check that output file doesn't exist */
	          if (fp_access (fpptr->outfile) == 0) {
		            fp_msg ("Error: output file already exists:\n "); 
			    fp_msg (fpptr->outfile);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		  } 
                  continue;
	      }     

	      /* construct output file name to test */
	      if (fpptr->prefix[0]) {
                  if (strlen(fpptr->prefix) + strlen(infits) > SZ_STR - 1) {
		      fp_msg ("Error: output file name for\n   "); fp_msg (infits);
		      fp_msg ("\n   is too long with the prefix\n"); fp_noop (); exit (-1);
	          }
	          strcpy(outfits,fpptr->prefix);
	      }

	      /* construct output file name */
	      if (infits[0] == '-') {
	        strcpy(outfits, "output.fits");
	      } else {
	        strcat(outfits, infits);
	      }

	      /* remove .gz or .bz2 suffix, if present (output is not gzipped) */
              namelen = strlen(outfits);
	      if (namelen >= 3 && !strcmp(".gz", outfits + namelen - 3) ) {
                        outfits[namelen - 3] = '\0';
	      }
              else if (namelen >= 4 && !strcmp(".bz2", outfits + namelen - 4)) {
                        outfits[namelen - 4] = '\0';
              }

	      /* check for .fz suffix that is sometimes required */
	      /* and remove it if present */
	      if (infits[0] != '-') {  /* if not reading from stdin stream */
                 namelen = strlen(outfits);
	         if (namelen>=3 && !strcmp(".fz", outfits + namelen - 3) ) { /* suffix is present */
                        outfits[namelen - 3] = '\0';
	         } else if (fpptr->delete_suffix) {  /* required suffix is missing */
		    fp_msg ("Error: input compressed file "); fp_msg (infits);
		    fp_msg ("\n does not have the default .fz suffix.\n"); 
		    fp_noop (); exit (-1);
	         }
	      }

	      /* if infits != outfits, make sure outfits doesn't already exist */
              if (strcmp(infits, outfits)) {
	                if (fp_access (outfits) == 0) {
		            fp_msg ("Error: output file already exists:\n "); fp_msg (outfits);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		        }       
	      }

	      /* if gzipping the output, make sure .gz file doesn't exist */
	      if (fpptr->do_gzip_file) {
                        if (strlen(outfits)+3 > SZ_STR-1)
                        {
		            fp_msg ("Error: output file name too long:\n "); fp_msg (outfits);
		            fp_msg ("\n "); fp_noop (); exit (-1);
                        }
	                strcat(outfits, ".gz");
	                if (fp_access (outfits) == 0) {
		            fp_msg ("Error: output file already exists:\n "); fp_msg (outfits);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		        }       
              		namelen = strlen(outfits);
                        outfits[namelen - 3] = '\0';  /* remove the .gz suffix again */
	      }
	  } else {
	  	/* ********** This section applies to fpack ************ */

	      /* check that input file  exists */
	      if (infits[0] != '-') {  /* if not reading from stdin stream */
	        if (fp_access (infits) != 0) {  /* if not, then check if */
                    if (strlen(infits)+3 > SZ_STR-1)
                    {
		        fp_msg ("Error: input file name too long:\n "); fp_msg (infits);
		        fp_msg ("\n "); fp_noop (); exit (-1);
                    }
		    strcat(infits, ".gz");     /* a gzipped version exsits */
	            if (fp_access (infits) != 0) {
                        namelen = strlen(infits);
                        infits[namelen - 3] = '\0';  /* remove the .gz suffix */
		        fp_msg ("Error: can't find or read input file "); fp_msg (infits);
		        fp_msg ("\n"); fp_noop (); exit (-1);
                    }
	        }
	      }

              /* make sure the file to pack does not already have a .fz suffix */
              namelen = strlen(infits);
	      if (namelen>=3 && !strcmp(".fz", infits + namelen - 3) ) {
		        fp_msg ("Error: fpack input file already has '.fz' suffix\n" ); fp_msg (infits);
		        fp_msg ("\n"); fp_noop (); exit (-1);
	      }

              /* if writing to stdout, or just testing the files, then we are all done */
	      if (fpptr->to_stdout || fpptr->test_all) {
                        continue;
	      }
              
              if (fpptr->outfile[0]) { /* user specified output file name */
                  nfiles++;
                  if (nfiles > 1) {
                      fp_msg("Error: cannot use same output file name for multiple files:\n   ");
                      fp_msg(fpptr->outfile);
		      fp_msg ("\n"); fp_noop (); exit (-1);
                  }

                  /* check that output file doesn't exist */
	          if (fp_access (fpptr->outfile) == 0) {
		            fp_msg ("Error: output file already exists:\n "); 
			    fp_msg (fpptr->outfile);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		  } 
                  continue;
              }

	      /* construct output file name */
	      if (infits[0] == '-') {
	        strcpy(outfits, "input.fits");
	      } else {
	        strcpy(outfits, infits);
	      }

	      /* remove .gz suffix, if present (output is not gzipped) */
              /* do the same if compression suffix is bz2 */
              namelen = strlen(outfits);
	      if (namelen >=3 && !strcmp(".gz", outfits + namelen - 3) ) {
                        outfits[namelen - 3] = '\0';
	      }
              else if (namelen >= 4 && !strcmp(".bz2", outfits + namelen - 4)) {
                        outfits[namelen - 4] = '\0';
              }
              
	      
	      /* remove .imh suffix (IRAF format image), and replace with .fits */
              namelen = strlen(outfits);
	      if (namelen >=4 && !strcmp(".imh", outfits + namelen - 4) ) {
                        outfits[namelen - 4] = '\0';
                        if (strlen(outfits) == SZ_STR-5)
                           strcat(outfits, ".fit");
                        else
                           strcat(outfits, ".fits");
	      }

	      /* If not clobbering the input file, add .fz suffix to output name */
	      if (! fpptr->clobber)
              {
                 if (strlen(outfits) > SZ_STR-4)
                 {
		    fp_msg ("Error: output file name too long:\n "); fp_msg (outfits);
		    fp_msg ("\n "); fp_noop (); exit (-1);
                 }
                 else
		     strcat(outfits, ".fz");
              }
			
	      /* if infits != outfits, make sure outfits doesn't already exist */
              if (strcmp(infits, outfits)) {
	                if (fp_access (outfits) == 0) {
		            fp_msg ("Error: output file already exists:\n "); fp_msg (outfits);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		        }       
	      }
	  }   /* end of fpack section */
	}

	fpptr->preflight_checked++;
	return(0);
}